

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::mouseDoubleClickEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  State SVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  QStyle *pQVar10;
  long lVar11;
  QWidget *this_01;
  long in_FS_OFFSET;
  double dVar12;
  double extraout_XMM1_Qa;
  double dVar13;
  undefined1 auVar14 [16];
  QPersistentModelIndex persistent;
  QPersistentModelIndex firstColumnIndex;
  ulong local_78;
  QModelIndex local_60;
  QPersistentModelIndex local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  SVar6 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar6 != NoState) goto LAB_005a324d;
  pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  local_60.i = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                        (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
  local_60.r = 0;
  local_60.c = 0;
  auVar14 = QEventPoint::position();
  dVar13 = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._0_8_;
  bVar5 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  dVar12 = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._8_8_;
  bVar3 = 2147483647.0 < dVar12;
  if (dVar12 <= -2147483648.0) {
    dVar12 = -2147483648.0;
  }
  local_40.d = (QPersistentModelIndexData *)
               CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar3 & (ulong)dVar12),
                        (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar5 & (ulong)dVar13));
  cVar4 = QRect::contains((QPoint *)&local_60,SUB81(&local_40,0));
  if (cVar4 == '\0') goto LAB_005a324d;
  auVar14 = QEventPoint::position();
  dVar13 = (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._0_8_;
  bVar5 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  local_60.r = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar13);
  dVar13 = (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._8_8_;
  bVar5 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  local_60.c = (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar13);
  iVar7 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_60);
  if (iVar7 != -1) goto LAB_005a324d;
  QEventPoint::position();
  dVar13 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_006605c0) +
           extraout_XMM1_Qa;
  bVar5 = 2147483647.0 < dVar13;
  if (dVar13 <= -2147483648.0) {
    dVar13 = -2147483648.0;
  }
  uVar8 = QTreeViewPrivate::itemAtCoordinate
                    (this_00,(int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                          ~-(ulong)bVar5 & (ulong)dVar13));
  local_78 = (ulong)uVar8;
  if (uVar8 == 0xffffffff) goto LAB_005a324d;
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  lVar9 = (long)(int)uVar8;
  QPersistentModelIndex::QPersistentModelIndex(&local_40,&(this_00->viewItems).d.ptr[lVar9].index);
  local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QEventPoint::position();
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_60,this);
  QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_60);
  cVar4 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).pressedIndex,&local_48);
  if (cVar4 == '\0') {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x98))(this,event);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
    QAbstractItemView::doubleClicked((QAbstractItemView *)this,&local_60);
    cVar4 = QPersistentModelIndex::isValid();
    if (cVar4 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
      cVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2e0))(this,&local_60,2,event);
      if ((cVar4 == '\0') &&
         (SVar6 = QAbstractItemView::state((QAbstractItemView *)this), SVar6 == NoState)) {
        pQVar10 = QWidget::style((QWidget *)this);
        iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x3d,0,this,0);
        if (iVar7 == 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
          QAbstractItemView::activated((QAbstractItemView *)this,&local_60);
        }
        (this_00->super_QAbstractItemViewPrivate).releaseFromDoubleClick = true;
        QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
        if ((this_00->itemsExpandable == true) && (this_00->expandsOnDoubleClick == true)) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
          bVar5 = QTreeViewPrivate::hasVisibleChildren(this_00,&local_60);
          if (bVar5) {
            lVar11 = (this_00->viewItems).d.size;
            if (lVar9 < lVar11) {
              cVar4 = comparesEqual(&local_40,&(this_00->viewItems).d.ptr[lVar9].index);
              if (cVar4 == '\0') {
                lVar11 = (this_00->viewItems).d.size;
                goto LAB_005a31bf;
              }
LAB_005a3205:
              if (((this_00->viewItems).d.ptr[lVar9].field_0x1c & 1) == 0) {
                QTreeViewPrivate::expand(this_00,(int)local_78,true);
              }
              else {
                QTreeViewPrivate::collapse(this_00,(int)local_78,true);
              }
              (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x268))(this);
              this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
              QWidget::update(this_01);
            }
            else {
LAB_005a31bf:
              if (lVar11 != 0) {
                lVar9 = 0;
                local_78 = 0;
                do {
                  cVar4 = comparesEqual(&local_40,
                                        (QModelIndex *)
                                        ((long)&(((this_00->viewItems).d.ptr)->index).r + lVar9));
                  uVar2 = (this_00->viewItems).d.size;
                  if (cVar4 != '\0') break;
                  local_78 = local_78 + 1;
                  lVar9 = lVar9 + 0x28;
                } while (local_78 < uVar2);
                if (uVar2 != local_78) {
                  lVar9 = (long)(int)local_78;
                  goto LAB_005a3205;
                }
              }
            }
          }
        }
      }
    }
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_005a324d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (state() != NoState || !d->viewport->rect().contains(event->position().toPoint()))
        return;

    int i = d->itemDecorationAt(event->position().toPoint());
    if (i == -1) {
        i = d->itemAtCoordinate(event->position().toPoint().y());
        if (i == -1)
            return; // user clicked outside the items

        const QPersistentModelIndex firstColumnIndex = d->viewItems.at(i).index;
        const QPersistentModelIndex persistent = indexAt(event->position().toPoint());

        if (d->pressedIndex != persistent) {
            mousePressEvent(event);
            return;
        }

        // signal handlers may change the model
        emit doubleClicked(persistent);

        if (!persistent.isValid())
            return;

        if (edit(persistent, DoubleClicked, event) || state() != NoState)
            return; // the double click triggered editing

        if (!style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
            emit activated(persistent);

        d->releaseFromDoubleClick = true;
        d->executePostedLayout(); // we need to make sure viewItems is updated
        if (d->itemsExpandable
            && d->expandsOnDoubleClick
            && d->hasVisibleChildren(persistent)) {
            if (!((i < d->viewItems.size()) && (d->viewItems.at(i).index == firstColumnIndex))) {
                // find the new index of the item
                for (i = 0; i < d->viewItems.size(); ++i) {
                    if (d->viewItems.at(i).index == firstColumnIndex)
                        break;
                }
                if (i == d->viewItems.size())
                    return;
            }
            if (d->viewItems.at(i).expanded)
                d->collapse(i, true);
            else
                d->expand(i, true);
            updateGeometries();
            viewport()->update();
        }
    }
}